

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

size_t flvtag_header_size(flvtag_t *tag)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  
  bVar1 = *tag->data;
  bVar3 = bVar1 & 0x1f;
  if (bVar3 == 9) {
    bVar1 = tag->data[0xb];
    sVar2 = 0xc;
    if ((bVar1 & 0xf) == 7) {
      sVar2 = (ulong)((bVar1 & 0xf0) != 0x50) * 3 + 0xd;
    }
  }
  else {
    sVar2 = 0xb;
    if (bVar3 == 8) {
      return (ulong)(bVar1 == 0xa8) | 0xc;
    }
  }
  return sVar2;
}

Assistant:

size_t flvtag_header_size(flvtag_t* tag)
{
    switch (flvtag_type(tag)) {
    case flvtag_type_audio:
        return FLV_TAG_HEADER_SIZE + (flvtag_soundformat_aac != flvtag_soundformat(tag) ? 1 : 2);

    case flvtag_type_video:
        // CommandFrame does not have a compositionTime
        return FLV_TAG_HEADER_SIZE + (flvtag_codecid_avc != flvtag_codecid(tag) ? 1 : (flvtag_frametype_commandframe != flvtag_frametype(tag) ? 5 : 2));

    default:
        return FLV_TAG_HEADER_SIZE;
    }
}